

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_METAL_start(Context *ctx,char *profilestr)

{
  char *pcVar1;
  
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if (ctx->mainfn != (char *)0x0) goto LAB_0010e345;
    pcVar1 = "FragmentShader";
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      failf(ctx,"Shader type %u unsupported in this profile.");
      return;
    }
    if (ctx->mainfn != (char *)0x0) goto LAB_0010e345;
    pcVar1 = "VertexShader";
  }
  pcVar1 = StrDup(ctx,pcVar1);
  ctx->mainfn = pcVar1;
LAB_0010e345:
  set_output(ctx,&ctx->mainline);
  ctx->indent = ctx->indent + 1;
  return;
}

Assistant:

static void emit_METAL_start(Context *ctx, const char *profilestr)
{
    if (!shader_is_vertex(ctx) && !shader_is_pixel(ctx))
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    if (!ctx->mainfn)
    {
        if (shader_is_vertex(ctx))
            ctx->mainfn = StrDup(ctx, "VertexShader");
        else if (shader_is_pixel(ctx))
            ctx->mainfn = StrDup(ctx, "FragmentShader");
    } // if

    set_output(ctx, &ctx->mainline);
    ctx->indent++;
}